

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

void nni_http_del_header(nng_http *conn,char *key)

{
  nng_http_res *pnVar1;
  int iVar2;
  http_header *h;
  nni_list *list;
  
  pnVar1 = &conn->res;
  if (conn->client != false) {
    pnVar1 = (nng_http_res *)&conn->req;
  }
  list = &(pnVar1->data).hdrs;
  h = (http_header *)nni_list_first(list);
  while (h != (http_header *)0x0) {
    iVar2 = nni_strcasecmp(key,h->name);
    if (iVar2 == 0) {
      nni_http_free_header(h);
      h = (http_header *)nni_list_first(list);
    }
    else {
      h = (http_header *)nni_list_next(list,h);
    }
  }
  return;
}

Assistant:

void
nni_http_del_header(nng_http *conn, const char *key)
{
	nni_list *hdrs =
	    conn->client ? &conn->req.data.hdrs : &conn->res.data.hdrs;
	while (http_del_header_one(hdrs, key)) {
		continue;
	}
}